

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomFourAction.cpp
# Opt level: O0

ActionResults * __thiscall GreenRoomFourAction::Look(GreenRoomFourAction *this)

{
  itemType iVar1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [8];
  string information_1;
  string local_70 [55];
  allocator local_39;
  string local_38 [8];
  string information;
  GreenRoomFourAction *this_local;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == KID) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "The child in front of you whispers repeatedly :aqua, water, ma\'an, eau, Wasser, vody...."
               ,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    this_local = (GreenRoomFourAction *)operator_new(0x30);
    std::__cxx11::string::string(local_70,local_38);
    ActionResults::ActionResults((ActionResults *)this_local,CURRENT,(string *)local_70);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_38);
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == CLEAN_BUCKET) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_98,
                 "You examine the bucket of ice cool water. You see the child\'s eyes lock on the bucket"
                 ,&local_99);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      this_local = (GreenRoomFourAction *)operator_new(0x30);
      std::__cxx11::string::string(local_c0,local_98);
      ActionResults::ActionResults((ActionResults *)this_local,CURRENT,(string *)local_c0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_98);
    }
    else {
      this_local = (GreenRoomFourAction *)AbstractRoomAction::Look(&this->super_AbstractRoomAction);
    }
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults * GreenRoomFourAction::Look() {

    if(commands->getMainItem() == KID) {
        std::string information = "The child in front of you whispers repeatedly :"
                "aqua, water, ma'an, eau, Wasser, vody....";
        return new ActionResults(CURRENT, information);
    } else if (commands->getMainItem() == CLEAN_BUCKET) {
        std::string information = "You examine the bucket of ice cool water. You see the child's eyes lock on the bucket";
        return new ActionResults(CURRENT, information);
    } else {
        return AbstractRoomAction::Look();
    }

}